

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_rational(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_attr_rational_t tmp;
  int32_t isz;
  exr_attr_v2i_t local_20;
  undefined4 local_14;
  
  local_20 = ((a->field_6).box2i)->min;
  local_14 = 8;
  eVar1 = (*ctxt->do_write)(ctxt,&local_14,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_20,8,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_rational (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t        rv;
    exr_attr_rational_t tmp = *(a->rational);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_rational_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 2);
    return rv;
}